

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmTargetTraceDependencies::Trace(cmTargetTraceDependencies *this)

{
  _Elt_pointer ppcVar1;
  cmSourceFile *this_00;
  bool bVar2;
  mapped_type *pmVar3;
  char *__s;
  string *psVar4;
  cmCustomCommand *cc;
  string *objDep;
  string *in_name;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objDeps;
  allocator<char> local_71;
  cmSourceFile *local_70;
  string *local_68;
  string *psStack_60;
  undefined8 local_58;
  string local_50;
  
  while (ppcVar1 = (this->SourceQueue).c.
                   super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur,
        (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur != ppcVar1) {
    local_70 = *ppcVar1;
    std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::pop_front(&(this->SourceQueue).c);
    pmVar3 = std::
             map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
             ::operator[](&this->GeneratorTarget->SourceDepends,&local_70);
    this_00 = local_70;
    this->CurrentEntry = pmVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"OBJECT_DEPENDS",(allocator<char> *)&local_68);
    __s = cmSourceFile::GetProperty(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (__s != (char *)0x0) {
      local_68 = (string *)0x0;
      psStack_60 = (string *)0x0;
      local_58 = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
      cmSystemTools::ExpandListArgument
                (&local_50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_68,false);
      std::__cxx11::string::~string((string *)&local_50);
      psVar4 = psStack_60;
      for (in_name = local_68; in_name != psVar4; in_name = in_name + 1) {
        bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar2) {
          cmsys::SystemTools::CollapseFullPath(&local_50,in_name);
          std::__cxx11::string::operator=((string *)in_name,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      FollowNames(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
    }
    psVar4 = cmSourceFile::GetFullPath(local_70,(string *)0x0);
    FollowName(this,psVar4);
    FollowNames(this,&local_70->Depends);
    cc = cmSourceFile::GetCustomCommand(local_70);
    if (cc != (cmCustomCommand *)0x0) {
      CheckCustomCommand(this,cc);
    }
  }
  this->CurrentEntry = (SourceEntry *)0x0;
  cmGeneratorTarget::AddTracedSources(this->GeneratorTarget,&this->NewSources);
  return;
}

Assistant:

void cmTargetTraceDependencies::Trace()
{
  // Process one dependency at a time until the queue is empty.
  while (!this->SourceQueue.empty()) {
    // Get the next source from the queue.
    cmSourceFile* sf = this->SourceQueue.front();
    this->SourceQueue.pop();
    this->CurrentEntry = &this->GeneratorTarget->SourceDepends[sf];

    // Queue dependencies added explicitly by the user.
    if (const char* additionalDeps = sf->GetProperty("OBJECT_DEPENDS")) {
      std::vector<std::string> objDeps;
      cmSystemTools::ExpandListArgument(additionalDeps, objDeps);
      for (std::string& objDep : objDeps) {
        if (cmSystemTools::FileIsFullPath(objDep)) {
          objDep = cmSystemTools::CollapseFullPath(objDep);
        }
      }
      this->FollowNames(objDeps);
    }

    // Queue the source needed to generate this file, if any.
    this->FollowName(sf->GetFullPath());

    // Queue dependencies added programmatically by commands.
    this->FollowNames(sf->GetDepends());

    // Queue custom command dependencies.
    if (cmCustomCommand const* cc = sf->GetCustomCommand()) {
      this->CheckCustomCommand(*cc);
    }
  }
  this->CurrentEntry = nullptr;

  this->GeneratorTarget->AddTracedSources(this->NewSources);
}